

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O1

ExpEmit __thiscall FxFloatCast::Emit(FxFloatCast *this,VMFunctionBuilder *build)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  
  uVar1 = (*this->basex->_vptr_FxExpression[7])();
  if ((uVar1 >> 0x10 & 1) != 0) {
    __assert_fail("!from.Konst",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_expression.cpp"
                  ,0x297,"virtual ExpEmit FxFloatCast::Emit(VMFunctionBuilder *)");
  }
  iVar2 = (*(this->basex->ValueType->super_DObject)._vptr_DObject[0x12])();
  if (iVar2 == 0) {
    if ((uVar1 & 0xfc00) == 0 && (uVar1 & 0x20000) == 0) {
      VMFunctionBuilder::RegAvailability::Return
                (build->Registers + ((uVar1 & 0xffff00) >> 8 & 3),uVar1 & 0xff,1);
    }
    uVar3 = VMFunctionBuilder::RegAvailability::Get(build->Registers + 1,1);
    VMFunctionBuilder::Emit(build,0x33,uVar3 & 0xff,uVar1 & 0xff,0);
    return (ExpEmit)((uint3)(uVar3 & 0xff) | 0x100);
  }
  __assert_fail("basex->ValueType->GetRegType() == REGT_INT",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_expression.cpp"
                ,0x298,"virtual ExpEmit FxFloatCast::Emit(VMFunctionBuilder *)");
}

Assistant:

ExpEmit FxFloatCast::Emit(VMFunctionBuilder *build)
{
	ExpEmit from = basex->Emit(build);
	assert(!from.Konst);
	assert(basex->ValueType->GetRegType() == REGT_INT);
	from.Free(build);
	ExpEmit to(build, REGT_FLOAT);
	build->Emit(OP_CAST, to.RegNum, from.RegNum, CAST_I2F);
	return to;
}